

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_create.cpp
# Opt level: O0

metatype * mpt::metatype::create(char *val,int len)

{
  byte bVar1;
  size_t sVar2;
  ssize_t sVar3;
  int local_38;
  metatype *b;
  metatype *m;
  int len_local;
  char *val_local;
  
  m._4_4_ = len;
  if (len < 0) {
    if (val == (char *)0x0) {
      local_38 = 0;
    }
    else {
      sVar2 = strlen(val);
      local_38 = (int)sVar2;
    }
    m._4_4_ = local_38;
  }
  if ((((val == (char *)0x0) ||
       (bVar1 = std::numeric_limits<unsigned_char>::max(), (int)(uint)bVar1 <= m._4_4_)) ||
      (val_local = (char *)basic::create(val,m._4_4_), (basic *)val_local == (basic *)0x0)) &&
     ((val_local = (char *)io::buffer::metatype::create((array *)0x0),
      (metatype *)val_local != (metatype *)0x0 && (val != (char *)0x0)))) {
    if ((m._4_4_ == 0) ||
       (sVar3 = encode_array::push(&(((metatype *)val_local)->super_buffer).super_encode_array,
                                   (long)m._4_4_,val), -1 < sVar3)) {
      encode_array::push(&(((metatype *)val_local)->super_buffer).super_encode_array,1,"");
      encode_array::push(&(((metatype *)val_local)->super_buffer).super_encode_array,0,(void *)0x0);
    }
    else {
      (*(((metatype *)val_local)->super_metatype).super_convertable._vptr_convertable[1])();
      val_local = (char *)0x0;
    }
  }
  return (metatype *)val_local;
}

Assistant:

metatype *metatype::create(const char *val, int len)
{
	if (len < 0) {
		len = val ? strlen(val) : 0;
	}
	// compatible small generic metatype
	if (val && len < std::numeric_limits<uint8_t>::max()) {
		metatype *m = metatype::basic::create(val, len);
		if (m) {
			return m;
		}
	}
	// create buffer-backed text metatype
	io::buffer::metatype *b;
	if ((b = mpt::io::buffer::metatype::create(0))
	 && val) {
		if (len && b->push(len, val) < 0) {
			b->unref();
			return 0;
		}
		b->push(1, "\0"); // terminate string
		b->push(0, 0);    // mark content finished
	}
	return b;
}